

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_safe_queue.h
# Opt level: O0

size_t __thiscall cppnet::ThreadSafeQueue<cppnet::Log_*>::Size(ThreadSafeQueue<cppnet::Log_*> *this)

{
  size_type sVar1;
  undefined1 local_20 [8];
  unique_lock<std::mutex> lock;
  ThreadSafeQueue<cppnet::Log_*> *this_local;
  
  lock._8_8_ = this;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_20,&this->_mutex);
  sVar1 = std::queue<cppnet::Log_*,_std::deque<cppnet::Log_*,_std::allocator<cppnet::Log_*>_>_>::
          size(&this->_queue);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_20);
  return sVar1;
}

Assistant:

size_t Size() {
        std::unique_lock<std::mutex> lock(_mutex);
        return _queue.size();
    }